

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

int Rtm_ObjCheckRetimeBwd(Rtm_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar1 = pObj->nFanouts;
  if (pObj->nFanouts < 1) {
    iVar1 = 0;
  }
  do {
    if (iVar1 == iVar2) {
      return 1;
    }
    iVar3 = (*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar2;
    iVar2 = iVar2 + 1;
  } while ((**(ushort **)(&pObj[1].field_0x8 + (ulong)(uint)(iVar3 * 2) * 8) & 0xfff) != 0);
  return 0;
}

Assistant:

int Rtm_ObjCheckRetimeBwd( Rtm_Obj_t * pObj )
{
    Rtm_Edg_t * pEdge;
    int i;
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        if ( pEdge->nLats == 0 )
            return 0;
    return 1;
}